

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O3

int fy_atom_memcmp(fy_atom *atom,void *ptr,size_t len)

{
  fy_input_type fVar1;
  fy_input *pfVar2;
  size_t sVar3;
  uint uVar4;
  long lVar5;
  size_t __n;
  void *pvVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  fy_atom_iter local_218;
  
  bVar9 = len != 0;
  if ((atom == (fy_atom *)0x0 && ptr == (void *)0x0) && len == 0) {
    return 0;
  }
  if ((ptr != (void *)0x0 || len != 0) && atom == (fy_atom *)0x0) {
    return -1;
  }
  if ((ptr == (void *)0x0 || len == 0) && atom != (fy_atom *)0x0) {
    return 1;
  }
  if ((atom->field_0x35 & 4) == 0) {
    fy_atom_iter_start(atom,&local_218);
    uVar4 = fy_atom_iter_getc(&local_218);
    uVar7 = 0xffffffff;
    if (-1 < (int)uVar4 && len != 0) {
      lVar5 = 0;
      while (uVar7 = uVar4, uVar7 == *(byte *)((long)ptr + lVar5)) {
        uVar4 = fy_atom_iter_getc(&local_218);
        bVar9 = len - 1 != lVar5;
        if (((int)uVar4 < 0) || (bVar10 = len - 1 == lVar5, lVar5 = lVar5 + 1, bVar10))
        goto LAB_0013fcdb;
      }
      bVar9 = true;
      uVar4 = uVar7;
      uVar7 = (uint)*(byte *)((long)ptr + lVar5);
    }
LAB_0013fcdb:
    if (local_218.chunks != local_218.startup_chunks &&
        local_218.chunks != (fy_atom_iter_chunk *)0x0) {
      free(local_218.chunks);
    }
    if (!(bool)(uVar4 != 0xffffffff | bVar9)) {
      return 0;
    }
    return (uint)((int)uVar7 <= (int)uVar4) * 2 + -1;
  }
  pfVar2 = atom->fyi;
  fVar1 = (pfVar2->cfg).type;
  if (fVar1 < fyit_callback) {
    sVar3 = (atom->start_mark).input_pos;
    lVar5 = 0x48;
    switch(fVar1) {
    case fyit_file:
      pvVar6 = (pfVar2->field_11).file.addr;
      if (pvVar6 != (void *)0x0) goto LAB_0013fc9f;
      break;
    case fyit_stream:
      break;
    default:
      lVar5 = 0x28;
    }
    pvVar6 = *(void **)((long)&(pfVar2->node).next + lVar5);
    if (pvVar6 != (void *)0x0) {
LAB_0013fc9f:
      uVar8 = (atom->end_mark).input_pos - sVar3;
      __n = len;
      if (uVar8 < len) {
        __n = uVar8;
      }
      uVar4 = memcmp((void *)((long)pvVar6 + sVar3),ptr,__n);
      if ((uVar4 == 0) && (uVar4 = -(uint)(uVar8 < len) | 1, uVar8 == len)) {
        uVar4 = 0;
      }
      return uVar4;
    }
  }
  __assert_fail("ptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-input.h"
                ,0x9a,"const void *fy_input_start(const struct fy_input *)");
}

Assistant:

int fy_atom_memcmp(struct fy_atom *atom, const void *ptr, size_t len) {
    const char *dstr, *str;
    size_t dlen, tlen;
    struct fy_atom_iter iter;
    int c, ct, ret;

    /* empty? just fine */
    if (!atom && !ptr && !len)
        return 0;

    /* empty atom but not ptr */
    if (!atom && (ptr || len))
        return -1;

    /* non empty atom and empty ptr */
    if (atom && (!ptr || !len))
        return 1;

    /* direct output, nice */
    if (atom->direct_output) {
        dlen = fy_atom_size(atom);
        dstr = fy_atom_data(atom);
        tlen = dlen > len ? len : dlen;
        ret = memcmp(dstr, ptr, tlen);
        if (ret)
            return ret;

        return dlen == len ? 0 : len > dlen ? -1 : 1;
    }

    str = ptr;
    ct = -1;
    fy_atom_iter_start(atom, &iter);
    while ((c = fy_atom_iter_getc(&iter)) >= 0 && len) {
        ct = *str & 0xff;
        if (ct != c)
            break;
        str++;
        len--;
    }
    fy_atom_iter_finish(&iter);

    /* out of data on both */
    if (c == -1 && !len)
        return 0;

    return ct > c ? -1 : 1;
}